

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O0

char __thiscall Fl_Preferences::get(Fl_Preferences *this,char *key,int *value,int defaultValue)

{
  char *__nptr;
  int local_34;
  char *v;
  int defaultValue_local;
  int *value_local;
  char *key_local;
  Fl_Preferences *this_local;
  
  __nptr = Node::get(this->node,key);
  local_34 = defaultValue;
  if (__nptr != (char *)0x0) {
    local_34 = atoi(__nptr);
  }
  *value = local_34;
  return __nptr != (char *)0x0;
}

Assistant:

char Fl_Preferences::get( const char *key, int &value, int defaultValue ) {
  const char *v = node->get( key );
  value = v ? atoi( v ) : defaultValue;
  return ( v != 0 );
}